

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall OpenMesh::PolyConnectivity::triangulate(PolyConnectivity *this,FaceHandle _fh)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  FaceHandle _fh_00;
  VertexHandle _start_vh;
  HalfedgeHandle _nheh;
  HalfedgeHandle new_heh;
  FaceHandle new_fh;
  HalfedgeHandle next_next_heh;
  BaseHandle local_34;
  BaseHandle local_30;
  BaseHandle local_2c;
  BaseHandle local_28;
  HalfedgeHandle next_heh;
  VertexHandle start_vh;
  HalfedgeHandle base_heh;
  PolyConnectivity *this_local;
  FaceHandle _fh_local;
  
  start_vh.super_BaseHandle.idx_ =
       (BaseHandle)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_fh);
  local_28.idx_ = (int)start_vh.super_BaseHandle.idx_;
  next_heh.super_BaseHandle.idx_ =
       (BaseHandle)
       ArrayKernel::from_vertex_handle
                 (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
  local_30.idx_ = (int)start_vh.super_BaseHandle.idx_;
  local_2c.idx_ =
       (int)ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
  while( true ) {
    HVar2 = ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
    local_34.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar2);
    bVar1 = BaseHandle::operator!=(&local_34,&next_heh.super_BaseHandle);
    if (!bVar1) break;
    HVar2 = ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
    _fh_00 = ArrayKernel::new_face(&this->super_ArrayKernel);
    ArrayKernel::set_halfedge_handle
              (&this->super_ArrayKernel,_fh_00,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
    _start_vh = ArrayKernel::to_vertex_handle
                          (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
    _nheh = ArrayKernel::new_edge
                      (&this->super_ArrayKernel,_start_vh,
                       (VertexHandle)next_heh.super_BaseHandle.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_,
               (HalfedgeHandle)local_2c.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,_nheh);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,_nheh,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
    ArrayKernel::set_face_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_,_fh_00);
    ArrayKernel::set_face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,_fh_00);
    ArrayKernel::set_face_handle(&this->super_ArrayKernel,_nheh,_fh_00);
    start_vh.super_BaseHandle.idx_ =
         (BaseHandle)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,_nheh);
    local_2c = HVar2.super_BaseHandle.idx_;
  }
  ArrayKernel::set_halfedge_handle
            (&this->super_ArrayKernel,_fh,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_,
             (HalfedgeHandle)local_2c.idx_);
  HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,HVar2,(HalfedgeHandle)start_vh.super_BaseHandle.idx_);
  ArrayKernel::set_face_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)start_vh.super_BaseHandle.idx_,_fh);
  return;
}

Assistant:

void PolyConnectivity::triangulate(FaceHandle _fh)
{
  /*
    Split an arbitrary face into triangles by connecting
    each vertex of fh after its second to vh.

    - fh will remain valid (it will become one of the
      triangles)
    - the halfedge handles of the new triangles will
      point to the old halfedges
  */

  HalfedgeHandle base_heh(halfedge_handle(_fh));
  VertexHandle start_vh = from_vertex_handle(base_heh);
  HalfedgeHandle next_heh(next_halfedge_handle(base_heh));

  while (to_vertex_handle(next_halfedge_handle(next_heh)) != start_vh)
  {
    HalfedgeHandle next_next_heh(next_halfedge_handle(next_heh));

    FaceHandle new_fh = new_face();
    set_halfedge_handle(new_fh, base_heh);

    HalfedgeHandle new_heh = new_edge(to_vertex_handle(next_heh), start_vh);

    set_next_halfedge_handle(base_heh, next_heh);
    set_next_halfedge_handle(next_heh, new_heh);
    set_next_halfedge_handle(new_heh, base_heh);

    set_face_handle(base_heh, new_fh);
    set_face_handle(next_heh, new_fh);
    set_face_handle(new_heh,  new_fh);

    base_heh = opposite_halfedge_handle(new_heh);
    next_heh = next_next_heh;
  }
  set_halfedge_handle(_fh, base_heh);  //the last face takes the handle _fh

  set_next_halfedge_handle(base_heh, next_heh);
  set_next_halfedge_handle(next_halfedge_handle(next_heh), base_heh);

  set_face_handle(base_heh, _fh);
}